

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void libcellml::buildMaps
               (ComponentEntityPtr *componentEntity,ComponentMap *componentMap,
               VariableMap *variableMap)

{
  size_t sVar1;
  ulong uVar2;
  ComponentPtr component;
  __shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar2 = 0;
  while( true ) {
    sVar1 = ComponentEntity::componentCount
                      ((componentEntity->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (sVar1 <= uVar2) break;
    ComponentEntity::component
              ((ComponentEntity *)&local_40,
               (size_t)(componentEntity->
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    buildMapsForComponentsVariables((ComponentPtr *)&local_40,componentMap,variableMap);
    std::__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>(local_50,&local_40);
    buildMaps((ComponentEntityPtr *)local_50,componentMap,variableMap);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void buildMaps(const ComponentEntityPtr &componentEntity, ComponentMap &componentMap, VariableMap &variableMap)
{
    for (size_t i = 0; i < componentEntity->componentCount(); ++i) {
        ComponentPtr component = componentEntity->component(i);
        buildMapsForComponentsVariables(component, componentMap, variableMap);
        buildMaps(component, componentMap, variableMap);
    }
}